

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O0

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule(LubyRestartsSchedule *this,longlong m)

{
  iterator this_00;
  _List_node_base *in_RSI;
  list<long_long,_std::allocator<long_long>_> *in_RDI;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd8;
  iterator local_20;
  _List_const_iterator<long_long> local_18;
  _List_node_base *local_10;
  
  local_10 = in_RSI;
  RestartsSchedule::RestartsSchedule((RestartsSchedule *)in_RDI);
  (in_RDI->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&PTR__LubyRestartsSchedule_00272570;
  (in_RDI->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
  super__List_node_base._M_prev = local_10;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list
            ((list<long_long,_std::allocator<long_long>_> *)0x1531f5);
  std::_List_const_iterator<long_long>::_List_const_iterator
            ((_List_const_iterator<long_long> *)
             &in_RDI[1].super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
              _M_size);
  this_00 = std::__cxx11::list<long_long,_std::allocator<long_long>_>::end(in_RDI);
  std::_List_const_iterator<long_long>::_List_const_iterator
            ((_List_const_iterator<long_long> *)&stack0xffffffffffffffd8,
             (iterator *)&stack0xffffffffffffffd0);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<long_long,_std::allocator<long_long>_>::insert
                 (this_00._M_node,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8);
  std::_List_const_iterator<long_long>::_List_const_iterator(&local_18,&local_20);
  in_RDI[1].super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size =
       (size_t)local_18._M_node;
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(long long m) :
    _backtracks_remaining(m)
{
    _current_sequence = _sequence.insert(_sequence.end(), m);
}